

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# free.c
# Opt level: O0

void freenode(astnode *ptr)

{
  int iVar1;
  astnode *ptr_local;
  
  if (ptr == (astnode *)0x0) {
    return;
  }
  iVar1 = ptr->type;
  if (iVar1 != 0x21) {
    if (((((iVar1 - 0x25U < 2) || (iVar1 - 0x2aU < 2)) || (iVar1 == 0x2d)) ||
        ((iVar1 == 0x2f || (iVar1 == 0x3c)))) ||
       ((iVar1 == 0x3e || ((iVar1 == 0x5e || (iVar1 == 0x7c)))))) {
LAB_001086f3:
      freenode((astnode *)ptr->right);
    }
    else if ((iVar1 != 0x7e) && (iVar1 != 0x125)) {
      if ((iVar1 - 0x129U < 8) || (iVar1 == 0x140)) goto LAB_001086f3;
      if ((iVar1 != 0x141) && (iVar1 != 0x14b)) {
        if (iVar1 != 0x170) {
          yyerror("Warning: Unknown expression type in free");
          return;
        }
        goto LAB_0010870d;
      }
    }
  }
  freenode((astnode *)ptr->left);
LAB_0010870d:
  free(ptr);
  return;
}

Assistant:

void freenode(struct astnode *ptr)
{
	
	if(ptr==NULL)
	{
		
		return;
		
	}
	
	switch(ptr->type)
	{
		case STATEMENT:
		
		case LOR:
		case LAND:
		case '|':
		case '^':
		case '&':
		case EQ:
		case NE:	
		case '>':
		case '<':
		case GE:	
		case LE:
		case SHL:
		case SHR:
		case '+':
		case '-':
		case '*':
		case '/':
		case '%':
			freenode(ptr->right);
			
		case COMPOUND:
		case RETURN: 
			
		case NEGATE:
		case '~':
		case '!':
			freenode(ptr->left);
			
		case ICONSTANT:
			free(ptr);
			break;
			
		default:
			yyerror("Warning: Unknown expression type in free");
			break;
		
	}
	
	return;
	
}